

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_carith.c
# Opt level: O2

int lj_carith_op(lua_State *L,MMS mm)

{
  long *plVar1;
  ushort uVar2;
  bool bVar3;
  uint8_t *puVar4;
  CTypeID CVar5;
  uint uVar6;
  CTSize CVar7;
  int iVar8;
  CType *pCVar9;
  CType *pCVar10;
  cTValue *tv;
  void *pvVar11;
  TValue *pTVar12;
  GCstr *pGVar13;
  ulong uVar14;
  CType *pCVar15;
  uint64_t uVar16;
  CType *pCVar17;
  ulong uVar18;
  ulong uVar19;
  uint uVar20;
  ErrMsg em;
  uint *puVar21;
  uint8_t *puVar22;
  long lVar23;
  ulong uVar24;
  CTState *cts;
  bool bVar25;
  ulong local_80;
  uint64_t u0;
  uint64_t local_70;
  int local_5c;
  CDArith ca;
  
  cts = (CTState *)(ulong)*(uint *)((ulong)(L->glref).ptr32 + 0x194);
  cts->L = L;
  pTVar12 = L->base;
  if (L->top <= pTVar12 + 1) {
    lj_err_argt(L,1,10);
  }
  local_5c = 1;
  for (lVar23 = 0; pCVar15 = ca.ct[0], puVar22 = ca.p[1], puVar4 = ca.p[0], lVar23 != 2;
      lVar23 = lVar23 + 1) {
    uVar6 = (pTVar12->field_2).it;
    if (uVar6 == 0xfffffff5) {
      uVar2 = *(ushort *)((ulong)(pTVar12->u32).lo + 6);
      pCVar10 = cts->tab;
      uVar6 = pCVar10[uVar2].info;
      puVar21 = (uint *)((ulong)(pTVar12->u32).lo + 8);
      if (uVar6 >> 0x1c == 6) {
        puVar21 = *(uint **)puVar21;
        CVar5 = lj_ctype_intern(cts,uVar2 | 0x20030000,8);
        pCVar17 = cts->tab;
        pCVar9 = pCVar17 + CVar5;
        if (lVar23 != 0) {
          ca.ct[0] = (CType *)((long)&pCVar17->info + ((long)pCVar15 - (long)pCVar10 & 0xffffffff0U)
                              );
        }
      }
      else {
        pCVar9 = pCVar10 + uVar2;
        pCVar17 = pCVar10;
        if (uVar6 >> 0x1c == 2) {
          if (pCVar9->size == 4) {
            puVar21 = (uint *)(ulong)*puVar21;
          }
          else {
            puVar21 = *(uint **)puVar21;
          }
          if ((uVar6 & 0xf0800000) == 0x20800000) {
            pCVar9 = (CType *)((long)&pCVar10->info + (ulong)((uVar6 & 0xffff) << 4));
          }
        }
      }
      pCVar15 = (CType *)((long)&pCVar17->info + (ulong)((pCVar9->info & 0xffff) << 4));
      if ((pCVar9->info & 0xf0000000) != 0x50000000) {
        pCVar15 = pCVar9;
      }
      ca.ct[lVar23] = pCVar15;
      ca.p[lVar23] = (uint8_t *)puVar21;
    }
    else if (uVar6 < 0xfffeffff) {
      ca.ct[lVar23] = cts->tab + 0xe;
      ca.p[lVar23] = (uint8_t *)pTVar12;
    }
    else if (uVar6 == 0xfffffffb) {
      uVar2 = *(ushort *)((ulong)pTVar12[(ulong)(lVar23 == 0) * 2 + -1].u32.lo + 6);
      pCVar15 = cts->tab;
      uVar6 = pCVar15[uVar2].info;
      ca.ct[lVar23] = (CType *)0x0;
      uVar20 = (pTVar12->u32).lo;
      ca.p[lVar23] = (uint8_t *)((GCstr *)(ulong)uVar20 + 1);
      local_5c = 0;
      if ((uVar6 & 0xf0000000) == 0x50000000) {
        pCVar15 = pCVar15 + uVar2;
        pCVar10 = lj_ctype_getfieldq(cts,pCVar15,(GCstr *)(ulong)uVar20,(CTSize *)&u0,(CTInfo *)0x0)
        ;
        if ((pCVar10 == (CType *)0x0) || ((pCVar10->info & 0xf0000000) != 0xb0000000)) {
          uVar6 = 1 - (int)lVar23;
          ca.ct[uVar6] = pCVar15;
          ca.p[uVar6] = (uint8_t *)0x0;
          goto LAB_0014938c;
        }
        ca.ct[lVar23] = (CType *)((long)&cts->tab->info + (ulong)((pCVar10->info & 0xffff) << 4));
        ca.p[lVar23] = (uint8_t *)&pCVar10->size;
        local_5c = 1;
      }
    }
    else if (uVar6 == 0xffffffff) {
      ca.ct[lVar23] = cts->tab + 0x11;
      ca.p[lVar23] = (uint8_t *)0x0;
    }
    else {
      ca.ct[lVar23] = (CType *)0x0;
      ca.p[lVar23] = (uint8_t *)0x1;
      local_5c = 0;
    }
    pTVar12 = pTVar12 + 1;
  }
  if (((local_5c == 0) || (mm == MM_FAST)) || (mm == MM_concat)) goto LAB_0014938c;
  uVar6 = ca.ct[0]->info;
  if (((0xfffffff < uVar6) || (8 < ca.ct[0]->size)) ||
     ((0xfffffff < ca.ct[1]->info || (8 < ca.ct[1]->size)))) {
    if ((uVar6 & 0xf0000000) == 0x20000000 || (uVar6 & 0xfc000000) == 0x30000000) {
      if (((mm < MM_mul) && ((0x8d0U >> (mm & (MM_unm|MM_pow)) & 1) != 0)) &&
         ((ca.ct[1]->info & 0xf0000000) == 0x20000000 || (ca.ct[1]->info & 0xfc000000) == 0x30000000
         )) {
        if (mm == MM_eq) {
          *(uint *)((long)L->top + -4) = (ca.p[0] != ca.p[1]) - 3;
          goto LAB_001496fa;
        }
        iVar8 = lj_cconv_compatptr(cts,ca.ct[0],ca.ct[1],8);
        if (iVar8 == 0) goto LAB_0014938c;
        if (mm == MM_sub) {
          CVar7 = lj_ctype_size(cts,(uint)(ushort)pCVar15->info);
          if (1 < CVar7 + 1) {
            L->top[-1].n = (double)(int)(((long)puVar4 - (long)puVar22) / (long)(int)CVar7);
            goto LAB_001496fa;
          }
          goto LAB_0014938c;
        }
        pTVar12 = L->top;
        if (mm == MM_lt) {
          iVar8 = -2 - (uint)(puVar4 < puVar22);
        }
        else {
          iVar8 = (puVar22 < puVar4) - 3;
        }
        goto LAB_001495e8;
      }
      if (((mm & ~MM_newindex) == MM_add) && (ca.ct[1]->info < 0x10000000)) {
        lj_cconv_ct_ct(cts,cts->tab + 0xb,ca.ct[1],(uint8_t *)&u0,ca.p[1],0);
        puVar22 = puVar4;
        if (mm == MM_sub) {
          u0 = -u0;
        }
        goto LAB_001492e1;
      }
    }
    else if ((mm == MM_add && uVar6 < 0x10000000) &&
            ((ca.ct[1]->info & 0xf0000000) == 0x20000000 ||
             (ca.ct[1]->info & 0xfc000000) == 0x30000000)) {
      lj_cconv_ct_ct(cts,cts->tab + 0xb,ca.ct[0],(uint8_t *)&u0,ca.p[0],0);
      pCVar15 = ca.ct[1];
LAB_001492e1:
      CVar7 = lj_ctype_size(cts,(uint)(ushort)pCVar15->info);
      if (CVar7 != 0xffffffff) {
        lVar23 = (long)(int)CVar7 * u0;
        CVar5 = lj_ctype_intern(cts,(ushort)pCVar15->info | 0x20030000,8);
        pvVar11 = lj_mem_newgco(cts->L,0x10);
        *(undefined1 *)((long)pvVar11 + 5) = 10;
        *(short *)((long)pvVar11 + 6) = (short)CVar5;
        plVar1 = (long *)((ulong)(cts->L->glref).ptr32 + 0xe0);
        *plVar1 = *plVar1 + 1;
        *(uint8_t **)((long)pvVar11 + 8) = puVar22 + lVar23;
        pTVar12 = L->top;
        pTVar12[-1].u32.lo = (uint32_t)pvVar11;
        *(undefined4 *)((long)pTVar12 + -4) = 0xfffffff5;
        goto switchD_00149524_default;
      }
    }
LAB_0014938c:
    pTVar12 = L->base;
    if ((pTVar12->field_2).it == 0xfffffff5) {
      uVar2 = *(ushort *)((ulong)(pTVar12->u32).lo + 6);
      uVar6 = cts->tab[uVar2].info;
      uVar20 = (uint)uVar2;
      if ((uVar6 & 0xf0000000) == 0x20000000) {
        uVar20 = uVar6 & 0xffff;
      }
      tv = lj_ctype_meta(cts,uVar20,mm);
      if (tv != (cTValue *)0x0) goto LAB_00149424;
      pTVar12 = L->base;
    }
    if ((pTVar12 + 1 < L->top) && (*(int *)((long)pTVar12 + 0xc) == -0xb)) {
      uVar2 = *(ushort *)((ulong)pTVar12[1].u32.lo + 6);
      uVar6 = cts->tab[uVar2].info;
      uVar20 = (uint)uVar2;
      if ((uVar6 & 0xf0000000) == 0x20000000) {
        uVar20 = uVar6 & 0xffff;
      }
      tv = lj_ctype_meta(cts,uVar20,mm);
      if (tv != (cTValue *)0x0) {
LAB_00149424:
        iVar8 = lj_meta_tailcall(L,tv);
        return iVar8;
      }
    }
    if (mm == MM_eq) {
      iVar8 = (ca.p[0] != ca.p[1]) - 3;
      *(int *)((long)L->top + -4) = iVar8;
      *(int *)((ulong)(L->glref).ptr32 + 0x124) = iVar8;
      return 1;
    }
    uVar18 = 0xffffffffffffffff;
    uVar19 = 0xffffffff;
    for (uVar24 = 0; uVar24 != 2; uVar24 = uVar24 + 1) {
      pCVar15 = ca.ct[uVar24];
      uVar6 = *(uint *)((long)L->base + uVar24 * 8 + 4);
      if ((pCVar15 == (CType *)0x0) || (uVar6 != 0xfffffff5)) {
        if (uVar6 == 0xfffffffb) {
          uVar19 = uVar24 & 0xffffffff;
        }
        uVar14 = 0xd;
        if ((0xfffeffff < uVar6) && (uVar14 = 3, (uVar6 & 0xffff8000) != 0xffff0000)) {
          uVar14 = (ulong)~uVar6;
        }
        pGVar13 = (GCstr *)lj_obj_itypename[uVar14];
      }
      else {
        if ((pCVar15->info & 0xf0000000) == 0x50000000) {
          uVar18 = uVar24;
        }
        uVar18 = uVar18 & 0xffffffff;
        pGVar13 = lj_ctype_repr(L,(CTypeID)((ulong)((long)pCVar15 - (long)cts->tab) >> 4),
                                (GCstr *)0x0);
        pGVar13 = pGVar13 + 1;
      }
      (&u0)[uVar24] = (uint64_t)pGVar13;
    }
    if (((uint)uVar19 ^ (uint)uVar18) == 1) {
      local_70 = (&u0)[(int)(uint)uVar18];
      uVar16 = (&u0)[(int)(uint)uVar19];
      em = LJ_ERR_FFI_BADCONV;
    }
    else {
      uVar16 = u0;
      if (mm == MM_FAST) {
        em = LJ_ERR_FFI_BADLEN;
      }
      else if (mm == MM_concat) {
        em = LJ_ERR_FFI_BADCONCAT;
      }
      else {
        em = LJ_ERR_FFI_BADARITH;
        if (mm < MM_add) {
          em = LJ_ERR_FFI_BADCOMP;
        }
      }
    }
    lj_err_callerv(L,em,uVar16,local_70);
  }
  if (((byte)(uVar6 >> 0x17) & ca.ct[0]->size == 8) == 0) {
    if ((ca.ct[1]->info >> 0x17 & 1) == 0) {
      iVar8 = 0xb;
    }
    else {
      iVar8 = (ca.ct[1]->size == 8) + 0xb;
    }
  }
  else {
    iVar8 = 0xc;
  }
  pCVar15 = (CType *)((long)&cts->tab->info + (ulong)(uint)(iVar8 << 4));
  lj_cconv_ct_ct(cts,pCVar15,ca.ct[0],(uint8_t *)&u0,ca.p[0],0);
  if (mm != MM_unm) {
    lj_cconv_ct_ct(cts,pCVar15,ca.ct[1],(uint8_t *)&local_80,ca.p[1],0);
    if (mm == MM_le) {
      bVar3 = (long)u0 <= (long)local_80;
      bVar25 = u0 <= local_80;
LAB_001495d2:
      if (iVar8 == 0xb) {
        bVar25 = bVar3;
      }
      iVar8 = -2 - (uint)bVar25;
    }
    else {
      if (mm == MM_lt) {
        bVar25 = u0 < local_80;
        bVar3 = (long)u0 < (long)local_80;
        goto LAB_001495d2;
      }
      if (mm != MM_eq) goto LAB_001494d0;
      iVar8 = (u0 != local_80) - 3;
    }
    pTVar12 = L->top;
LAB_001495e8:
    *(int *)((long)pTVar12 + -4) = iVar8;
    goto LAB_001496fa;
  }
LAB_001494d0:
  pvVar11 = lj_mem_newgco(cts->L,0x10);
  *(undefined1 *)((long)pvVar11 + 5) = 10;
  *(short *)((long)pvVar11 + 6) = (short)iVar8;
  plVar1 = (long *)((ulong)(cts->L->glref).ptr32 + 0xe0);
  *plVar1 = *plVar1 + 1;
  pTVar12 = L->top;
  pTVar12[-1].u32.lo = (uint32_t)pvVar11;
  *(undefined4 *)((long)pTVar12 + -4) = 0xfffffff5;
  switch(mm) {
  case MM_add:
    uVar18 = local_80 + u0;
    break;
  case MM_sub:
    uVar18 = u0 - local_80;
    break;
  case MM_mul:
    uVar18 = local_80 * u0;
    break;
  case MM_div:
    uVar18 = 0x8000000000000000;
    if (iVar8 == 0xb) {
      if ((local_80 != 0) && (local_80 != 0xffffffffffffffff || u0 != 0x8000000000000000)) {
        uVar18 = (long)u0 / (long)local_80;
      }
    }
    else if (local_80 != 0) {
      uVar18 = u0 / local_80;
    }
    break;
  case MM_mod:
    uVar18 = 0x8000000000000000;
    if (iVar8 == 0xb) {
      if (local_80 != 0) {
        if (local_80 == 0xffffffffffffffff && u0 == 0x8000000000000000) {
          uVar18 = 0;
        }
        else {
          uVar18 = (long)u0 % (long)local_80;
        }
      }
    }
    else if (local_80 != 0) {
      uVar18 = u0 % local_80;
    }
    break;
  case MM_pow:
    if (iVar8 == 0xb) {
      uVar18 = lj_carith_powi64(u0,local_80);
    }
    else {
      uVar18 = lj_carith_powu64(u0,local_80);
    }
    break;
  case MM_unm:
    uVar18 = -u0;
    break;
  default:
    goto switchD_00149524_default;
  }
  *(ulong *)((long)pvVar11 + 8) = uVar18;
switchD_00149524_default:
  uVar18 = (ulong)(L->glref).ptr32;
  if (*(uint *)(uVar18 + 0x54) <= *(uint *)(uVar18 + 0x50)) {
    lj_gc_step(L);
  }
LAB_001496fa:
  *(TValue *)((ulong)(L->glref).ptr32 + 0x120) = L->top[-1];
  return 1;
}

Assistant:

int lj_carith_op(lua_State *L, MMS mm)
{
  CTState *cts = ctype_cts(L);
  CDArith ca;
  if (carith_checkarg(L, cts, &ca) && mm != MM_len && mm != MM_concat) {
    if (carith_int64(L, cts, &ca, mm) || carith_ptr(L, cts, &ca, mm)) {
      copyTV(L, &G(L)->tmptv2, L->top-1);  /* Remember for trace recorder. */
      return 1;
    }
  }
  return lj_carith_meta(L, cts, &ca, mm);
}